

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall H264StreamReader::calcPicOrder(H264StreamReader *this,SliceUnit *slice)

{
  bool bVar1;
  uint uVar2;
  SPSUnit *pSVar3;
  ostream *poVar4;
  VodCoreException *this_00;
  int local_1d0;
  int PicOrderCntMsb;
  int MaxPicOrderCntLsb;
  int PicOrderCntLsb;
  ostringstream local_190 [8];
  ostringstream ss;
  SliceUnit *slice_local;
  H264StreamReader *this_local;
  
  pSVar3 = SliceUnit::getSPS(slice);
  if (pSVar3->pic_order_cnt_type == 0) {
    bVar1 = SliceUnit::isIDR(slice);
    if (bVar1) {
      this->prevPicOrderCntLsb = 0;
      this->prevPicOrderCntMsb = 0;
    }
    uVar2 = (uint)slice->pic_order_cnt_lsb;
    pSVar3 = SliceUnit::getSPS(slice);
    local_1d0 = 1 << ((byte)pSVar3->log2_max_pic_order_cnt_lsb & 0x1f);
    if (((int)uVar2 < this->prevPicOrderCntLsb) &&
       (local_1d0 / 2 <= (int)(this->prevPicOrderCntLsb - uVar2))) {
      local_1d0 = this->prevPicOrderCntMsb + local_1d0;
    }
    else if ((this->prevPicOrderCntLsb < (int)uVar2) &&
            (local_1d0 / 2 < (int)(uVar2 - this->prevPicOrderCntLsb))) {
      local_1d0 = this->prevPicOrderCntMsb - local_1d0;
    }
    else {
      local_1d0 = this->prevPicOrderCntMsb;
    }
    if (slice->memory_management_control_operation == 5) {
      this->prevPicOrderCntMsb = 0;
      if (slice->bottom_field_flag == 0) {
        this->prevPicOrderCntLsb = local_1d0 + uVar2;
      }
      else {
        this->prevPicOrderCntLsb = 0;
      }
    }
    else {
      this->prevPicOrderCntMsb = local_1d0;
      this->prevPicOrderCntLsb = uVar2;
    }
    return (int)(local_1d0 + uVar2) >> ((byte)this->m_forceLsbDiv & 0x1f);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar4 = std::operator<<((ostream *)local_190,"SPS picture order ");
  pSVar3 = SliceUnit::getSPS(slice);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pSVar3->pic_order_cnt_type);
  std::operator<<(poVar4," not supported.");
  this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  VodCoreException::VodCoreException(this_00,0x12e,(string *)&PicOrderCntLsb);
  __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

int H264StreamReader::calcPicOrder(const SliceUnit &slice)
{
    if (slice.getSPS()->pic_order_cnt_type != 0)
        THROW(ERR_H264_UNSUPPORTED_PARAMETER,
              "SPS picture order " << slice.getSPS()->pic_order_cnt_type << " not supported.")

    if (slice.isIDR())
        prevPicOrderCntMsb = prevPicOrderCntLsb = 0;

    const int PicOrderCntLsb = slice.pic_order_cnt_lsb;
    const int MaxPicOrderCntLsb = 1 << slice.getSPS()->log2_max_pic_order_cnt_lsb;
    int PicOrderCntMsb;

    if ((PicOrderCntLsb < prevPicOrderCntLsb) && ((prevPicOrderCntLsb - PicOrderCntLsb) >= (MaxPicOrderCntLsb / 2)))
        PicOrderCntMsb = prevPicOrderCntMsb + MaxPicOrderCntLsb;
    else if ((PicOrderCntLsb > prevPicOrderCntLsb) && ((PicOrderCntLsb - prevPicOrderCntLsb) > (MaxPicOrderCntLsb / 2)))
        PicOrderCntMsb = prevPicOrderCntMsb - MaxPicOrderCntLsb;
    else
        PicOrderCntMsb = prevPicOrderCntMsb;

    if (slice.memory_management_control_operation == 5)
    {
        prevPicOrderCntMsb = 0;
        if (!slice.bottom_field_flag)
            prevPicOrderCntLsb = PicOrderCntMsb + PicOrderCntLsb;
        else
            prevPicOrderCntLsb = 0;
    }
    else
    {
        prevPicOrderCntMsb = PicOrderCntMsb;
        prevPicOrderCntLsb = PicOrderCntLsb;
    }
    return (PicOrderCntMsb + PicOrderCntLsb) >> m_forceLsbDiv;
}